

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

SQRESULT sqstd_loadfile(HSQUIRRELVM v,SQChar *filename,SQBool printerror)

{
  SQRESULT SVar1;
  SQInteger SVar2;
  undefined1 local_860 [8];
  IOBuffer buffer;
  SQLEXREADFUNC func;
  uchar uc;
  SQInteger SStack_38;
  unsigned_short us;
  SQInteger ret;
  SQFILE file;
  SQBool printerror_local;
  SQChar *filename_local;
  HSQUIRRELVM v_local;
  
  file = (SQFILE)printerror;
  printerror_local = (SQBool)filename;
  filename_local = (SQChar *)v;
  ret = (SQInteger)sqstd_fopen(filename,"rb");
  buffer.file = _io_file_lexfeed_PLAIN;
  if ((SQFILE)ret == (SQFILE)0x0) {
    SVar1 = sq_throwerror((HSQUIRRELVM)filename_local,"cannot open the file");
    return SVar1;
  }
  SStack_38 = sqstd_fread((void *)((long)&func + 6),1,2,(SQFILE)ret);
  if (SStack_38 != 2) {
    func._6_2_ = 0;
  }
  if (func._6_2_ == -0x506) {
    sqstd_fseek((SQFILE)ret,0,2);
    SVar1 = sq_readclosure((HSQUIRRELVM)filename_local,file_read,(SQUserPointer)ret);
    if (-1 < SVar1) {
      sqstd_fclose((SQFILE)ret);
      return 0;
    }
  }
  else {
    if (func._6_2_ == -0x4411) {
      SVar2 = sqstd_fread((void *)((long)&func + 5),1,1,(SQFILE)ret);
      if (SVar2 == 0) {
        sqstd_fclose((SQFILE)ret);
        SVar1 = sq_throwerror((HSQUIRRELVM)filename_local,"io error");
        return SVar1;
      }
      if (func._5_1_ != -0x41) {
        sqstd_fclose((SQFILE)ret);
        SVar1 = sq_throwerror((HSQUIRRELVM)filename_local,"Unrecognized encoding");
        return SVar1;
      }
      buffer.file = _io_file_lexfeed_PLAIN;
    }
    else if (func._6_2_ == -0x101) {
      buffer.file = _io_file_lexfeed_UCS2_LE;
    }
    else if (func._6_2_ == -2) {
      buffer.file = _io_file_lexfeed_UCS2_BE;
    }
    else {
      sqstd_fseek((SQFILE)ret,0,2);
    }
    buffer.size = 0;
    buffer.buffer[0x7f8] = '\0';
    buffer.buffer[0x7f9] = '\0';
    buffer.buffer[0x7fa] = '\0';
    buffer.buffer[0x7fb] = '\0';
    buffer.buffer[0x7fc] = '\0';
    buffer.buffer[0x7fd] = '\0';
    buffer.buffer[0x7fe] = '\0';
    buffer.buffer[0x7ff] = '\0';
    buffer.ptr = ret;
    SVar1 = sq_compile((HSQUIRRELVM)filename_local,(SQLEXREADFUNC)buffer.file,local_860,
                       (SQChar *)printerror_local,(SQBool)file);
    if (-1 < SVar1) {
      sqstd_fclose((SQFILE)ret);
      return 0;
    }
  }
  sqstd_fclose((SQFILE)ret);
  return -1;
}

Assistant:

SQRESULT sqstd_loadfile(HSQUIRRELVM v,const SQChar *filename,SQBool printerror)
{
    SQFILE file = sqstd_fopen(filename,_SC("rb"));

    SQInteger ret;
    unsigned short us;
    unsigned char uc;
    SQLEXREADFUNC func = _io_file_lexfeed_PLAIN;
    if(file){
        ret = sqstd_fread(&us,1,2,file);
        if(ret != 2) {
            //probably an empty file
            us = 0;
        }
        if(us == SQ_BYTECODE_STREAM_TAG) { //BYTECODE
            sqstd_fseek(file,0,SQ_SEEK_SET);
            if(SQ_SUCCEEDED(sq_readclosure(v,file_read,file))) {
                sqstd_fclose(file);
                return SQ_OK;
            }
        }
        else { //SCRIPT

            switch(us)
            {
                //gotta swap the next 2 lines on BIG endian machines
                case 0xFFFE: func = _io_file_lexfeed_UCS2_BE; break;//UTF-16 little endian;
                case 0xFEFF: func = _io_file_lexfeed_UCS2_LE; break;//UTF-16 big endian;
                case 0xBBEF:
                    if(sqstd_fread(&uc,1,sizeof(uc),file) == 0) {
                        sqstd_fclose(file);
                        return sq_throwerror(v,_SC("io error"));
                    }
                    if(uc != 0xBF) {
                        sqstd_fclose(file);
                        return sq_throwerror(v,_SC("Unrecognized encoding"));
                    }
#ifdef SQUNICODE
                    func = _io_file_lexfeed_UTF8;
#else
                    func = _io_file_lexfeed_PLAIN;
#endif
                    break;//UTF-8 ;
                default: sqstd_fseek(file,0,SQ_SEEK_SET); break; // ascii
            }
            IOBuffer buffer;
            buffer.ptr = 0;
            buffer.size = 0;
            buffer.file = file;
            if(SQ_SUCCEEDED(sq_compile(v,func,&buffer,filename,printerror))){
                sqstd_fclose(file);
                return SQ_OK;
            }
        }
        sqstd_fclose(file);
        return SQ_ERROR;
    }
    return sq_throwerror(v,_SC("cannot open the file"));
}